

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_equal(lua_State *L,int idx1,int idx2)

{
  uint uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  
  pTVar2 = index2adr(L,idx1);
  pTVar3 = index2adr(L,idx2);
  uVar1 = (pTVar2->field_2).it;
  if ((pTVar3->field_2).it < 0xffff0000 && uVar1 < 0xffff0000) {
    pTVar4 = (TValue *)(ulong)(-(uint)(pTVar3->n == pTVar2->n) & 1);
  }
  else {
    pTVar4 = (TValue *)0x0;
    if (uVar1 == (pTVar3->field_2).it) {
      if (uVar1 < 0xfffffffd) {
        if ((uVar1 & 0xffff8000) == 0xffff0000) {
          pTVar4 = (TValue *)(ulong)(pTVar2->u64 == pTVar3->u64);
        }
        else if ((pTVar2->u32).lo == (pTVar3->u32).lo) {
          pTVar4 = (TValue *)0x1;
        }
        else {
          pTVar4 = (TValue *)0x0;
          if (uVar1 < 0xfffffff5) {
            pTVar4 = lj_meta_equal(L,(GCobj *)(ulong)(pTVar2->u32).lo,
                                   (GCobj *)(ulong)(pTVar3->u32).lo,0);
            if ((TValue *)0x1 < pTVar4) {
              L->top = pTVar4 + 2;
              lj_vm_call(L,pTVar4,2);
              pTVar2 = L->top;
              L->top = pTVar2 + -2;
              pTVar4 = (TValue *)(ulong)(*(uint *)((long)pTVar2 + -4) < 0xfffffffe);
            }
          }
        }
      }
      else {
        pTVar4 = (TValue *)((ulong)(L->glref).ptr32 + 0x68);
        pTVar4 = (TValue *)(ulong)(pTVar3 != pTVar4 && pTVar2 != pTVar4);
      }
    }
  }
  return (int)pTVar4;
}

Assistant:

LUA_API int lua_equal(lua_State *L, int idx1, int idx2)
{
  cTValue *o1 = index2adr(L, idx1);
  cTValue *o2 = index2adr(L, idx2);
  if (tvisint(o1) && tvisint(o2)) {
    return intV(o1) == intV(o2);
  } else if (tvisnumber(o1) && tvisnumber(o2)) {
    return numberVnum(o1) == numberVnum(o2);
  } else if (itype(o1) != itype(o2)) {
    return 0;
  } else if (tvispri(o1)) {
    return o1 != niltv(L) && o2 != niltv(L);
#if LJ_64
  } else if (tvislightud(o1)) {
    return o1->u64 == o2->u64;
#endif
  } else if (gcrefeq(o1->gcr, o2->gcr)) {
    return 1;
  } else if (!tvistabud(o1)) {
    return 0;
  } else {
    TValue *base = lj_meta_equal(L, gcV(o1), gcV(o2), 0);
    if ((uintptr_t)base <= 1) {
      return (int)(uintptr_t)base;
    } else {
      L->top = base+2;
      lj_vm_call(L, base, 1+1);
      L->top -= 2;
      return tvistruecond(L->top+1);
    }
  }
}